

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::ModportSymbol::fromSyntax
               (ASTContext *context,ModportDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ModportSymbol_*> *results)

{
  SyntaxKind SVar1;
  ModportSymbol *this;
  bool bVar2;
  bool bVar3;
  ArgumentDirection direction_00;
  Compilation *args;
  Scope *pSVar4;
  AnsiPortListSyntax *pAVar5;
  MemberSyntax *this_00;
  ModportSimplePortListSyntax *pMVar6;
  ModportPortSymbol *pMVar7;
  ModportExplicitPortSyntax *syntax_00;
  ModportSubroutinePortListSyntax *pMVar8;
  ModportNamedPortSyntax *pMVar9;
  ModportSubroutinePortSyntax *syntax_01;
  MethodPrototypeSymbol *pMVar10;
  ModportClockingSymbol *this_01;
  logic_error *plVar11;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  string local_430;
  allocator<char> local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> local_368;
  ModportClockingSymbol *local_358;
  ModportClockingSymbol *mcs;
  ModportClockingPortSyntax *clockingPort;
  string local_340;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> local_278;
  MethodPrototypeSymbol *local_268;
  MethodPrototypeSymbol *mps_1;
  MethodPrototypeSymbol *local_250;
  MethodPrototypeSymbol *mps;
  ModportPortSyntax *subPort;
  iterator __end5_1;
  iterator __begin5_1;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *__range5_1;
  bool isExport;
  ModportSubroutinePortListSyntax *portList_1;
  string local_200;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> local_128;
  ModportPortSymbol *local_118;
  ModportPortSymbol *mpp_1;
  ModportPortSymbol *local_100;
  ModportPortSymbol *mpp;
  ModportPortSyntax *simplePort;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *__range5;
  ArgumentDirection direction;
  ModportSimplePortListSyntax *portList;
  MemberSyntax *port;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *__range3;
  SourceLocation local_78;
  string_view local_70;
  ModportSymbol *local_60;
  ModportSymbol *modport;
  ModportItemSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *__range2;
  Compilation *comp;
  SmallVectorBase<const_slang::ast::ModportSymbol_*> *results_local;
  ModportDeclarationSyntax *syntax_local;
  ASTContext *context_local;
  
  args = ASTContext::getCompilation(context);
  join_0x00000010_0x00000000_ =
       slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::begin(&syntax->items);
  _item = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::end(&syntax->items);
  do {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ModportItemSyntax_*,_unsigned_long,_const_slang::syntax::ModportItemSyntax_**,_const_slang::syntax::ModportItemSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ModportItemSyntax_*,_unsigned_long,_const_slang::syntax::ModportItemSyntax_**,_const_slang::syntax::ModportItemSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<const_slang::syntax::ModportItemSyntax_*> *)&item);
    if (!bVar2) {
      return;
    }
    modport = (ModportSymbol *)
              slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
              iterator_base<const_slang::syntax::ModportItemSyntax_*>::operator*
                        ((iterator_base<const_slang::syntax::ModportItemSyntax_*> *)&__end2.index);
    local_70 = parsing::Token::valueText((Token *)&(modport->super_Symbol).name._M_str);
    local_78 = parsing::Token::location((Token *)&(modport->super_Symbol).name._M_str);
    local_60 = BumpAllocator::
               emplace<slang::ast::ModportSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (&args->super_BumpAllocator,args,&local_70,&local_78);
    Symbol::setSyntax(&local_60->super_Symbol,(SyntaxNode *)modport);
    this = local_60;
    pSVar4 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
    syntax_02 = slang::syntax::SyntaxList::operator_cast_to_span
                          ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
    Symbol::setAttributes(&this->super_Symbol,pSVar4,syntax_02);
    SmallVectorBase<const_slang::ast::ModportSymbol_*>::push_back(results,&local_60);
    pAVar5 = not_null<slang::syntax::AnsiPortListSyntax_*>::operator->
                       ((not_null<slang::syntax::AnsiPortListSyntax_*> *)
                        &(modport->super_Symbol).parentScope);
    join_0x00000010_0x00000000_ =
         slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::begin(&pAVar5->ports);
    _port = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::end(&pAVar5->ports);
    while (bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MemberSyntax_*,_unsigned_long,_slang::syntax::MemberSyntax_**,_slang::syntax::MemberSyntax_*&>
                   ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MemberSyntax_*,_unsigned_long,_slang::syntax::MemberSyntax_**,_slang::syntax::MemberSyntax_*&>
                                 *)&__end3.index,
                                (iterator_base<slang::syntax::MemberSyntax_*> *)&port), bVar2) {
      this_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::
                iterator_base<slang::syntax::MemberSyntax_*>::operator*
                          ((iterator_base<slang::syntax::MemberSyntax_*> *)&__end3.index);
      SVar1 = (this_00->super_SyntaxNode).kind;
      if (SVar1 == ModportClockingPort) {
        mcs = (ModportClockingSymbol *)
              slang::syntax::SyntaxNode::as<slang::syntax::ModportClockingPortSyntax>
                        (&this_00->super_SyntaxNode);
        this_01 = ModportClockingSymbol::fromSyntax(context,(ModportClockingPortSyntax *)mcs);
        pSVar4 = &local_60->super_Scope;
        local_358 = this_01;
        nonstd::span_lite::
        span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                  (&local_368,
                   (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                   &(mcs->super_Symbol).name._M_str);
        Symbol::setAttributes(&this_01->super_Symbol,pSVar4,local_368);
        Scope::addMember(&local_60->super_Scope,&local_358->super_Symbol);
      }
      else if (SVar1 == ModportSimplePortList) {
        pMVar6 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSimplePortListSyntax>
                           (&this_00->super_SyntaxNode);
        direction_00 = SemanticFacts::getDirection((pMVar6->direction).kind);
        join_0x00000010_0x00000000_ =
             slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::begin
                       (&pMVar6->ports);
        _simplePort = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::end
                                (&pMVar6->ports);
        while (bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                       ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                                     *)&__end5.index,
                                    (iterator_base<slang::syntax::ModportPortSyntax_*> *)&simplePort
                                   ), bVar2) {
          mpp = (ModportPortSymbol *)
                slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                iterator_base<slang::syntax::ModportPortSyntax_*>::operator*
                          ((iterator_base<slang::syntax::ModportPortSyntax_*> *)&__end5.index);
          SVar1 = *(SyntaxKind *)&(mpp->super_ValueSymbol).super_Symbol.name._M_len;
          if (SVar1 == ModportExplicitPort) {
            syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::ModportExplicitPortSyntax>
                                  ((SyntaxNode *)mpp);
            pMVar7 = ModportPortSymbol::fromSyntax(context,direction_00,syntax_00);
            pSVar4 = &local_60->super_Scope;
            local_118 = pMVar7;
            nonstd::span_lite::
            span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                      (&local_128,&(pMVar6->super_MemberSyntax).attributes);
            Symbol::setAttributes((Symbol *)pMVar7,pSVar4,local_128);
            Scope::addMember(&local_60->super_Scope,(Symbol *)local_118);
          }
          else {
            if (SVar1 != ModportNamedPort) {
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                         ,&local_1c9);
              std::operator+(&local_1a8,&local_1c8,":");
              std::__cxx11::to_string(&local_200,0x156);
              std::operator+(&local_188,&local_1a8,&local_200);
              std::operator+(&local_168,&local_188,": ");
              std::operator+(&local_148,&local_168,"Default case should be unreachable!");
              std::logic_error::logic_error(plVar11,(string *)&local_148);
              __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            pMVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>
                               ((SyntaxNode *)mpp);
            pMVar7 = ModportPortSymbol::fromSyntax(context,direction_00,pMVar9);
            pSVar4 = &local_60->super_Scope;
            local_100 = pMVar7;
            nonstd::span_lite::
            span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)&mpp_1,&(pMVar6->super_MemberSyntax).attributes);
            Symbol::setAttributes((Symbol *)pMVar7,pSVar4,_mpp_1);
            Scope::addMember(&local_60->super_Scope,(Symbol *)local_100);
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
          ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                        *)&__end5.index);
        }
      }
      else {
        if (SVar1 != ModportSubroutinePortList) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,&local_409);
          std::operator+(&local_3e8,&local_408,":");
          std::__cxx11::to_string(&local_430,0x180);
          std::operator+(&local_3c8,&local_3e8,&local_430);
          std::operator+(&local_3a8,&local_3c8,": ");
          std::operator+(&local_388,&local_3a8,"Default case should be unreachable!");
          std::logic_error::logic_error(plVar11,(string *)&local_388);
          __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pMVar8 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortListSyntax>
                           (&this_00->super_SyntaxNode);
        bVar2 = (pMVar8->importExport).kind == ExportKeyword;
        if (bVar2) {
          local_60->hasExports = true;
        }
        join_0x00000010_0x00000000_ =
             slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::begin
                       (&pMVar8->ports);
        _subPort = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::end
                             (&pMVar8->ports);
        while (bVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                       ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                                     *)&__end5_1.index,
                                    (iterator_base<slang::syntax::ModportPortSyntax_*> *)&subPort),
              bVar3) {
          mps = (MethodPrototypeSymbol *)
                slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                iterator_base<slang::syntax::ModportPortSyntax_*>::operator*
                          ((iterator_base<slang::syntax::ModportPortSyntax_*> *)&__end5_1.index);
          SVar1 = *(SyntaxKind *)&(mps->super_Symbol).name._M_len;
          if (SVar1 == ModportNamedPort) {
            pMVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>
                               ((SyntaxNode *)mps);
            pMVar10 = MethodPrototypeSymbol::fromSyntax(context,pMVar9,bVar2);
            pSVar4 = &local_60->super_Scope;
            local_250 = pMVar10;
            nonstd::span_lite::
            span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)&mps_1,&(pMVar8->super_MemberSyntax).attributes);
            Symbol::setAttributes(&pMVar10->super_Symbol,pSVar4,_mps_1);
            Scope::addMember(&local_60->super_Scope,&local_250->super_Symbol);
          }
          else {
            if (SVar1 != ModportSubroutinePort) {
              clockingPort._7_1_ = 1;
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_318,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                         ,&local_319);
              std::operator+(&local_2f8,&local_318,":");
              std::__cxx11::to_string(&local_340,0x173);
              std::operator+(&local_2d8,&local_2f8,&local_340);
              std::operator+(&local_2b8,&local_2d8,": ");
              std::operator+(&local_298,&local_2b8,"Default case should be unreachable!");
              std::logic_error::logic_error(plVar11,(string *)&local_298);
              clockingPort._7_1_ = 0;
              __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            pSVar4 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
            syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortSyntax>
                                  ((SyntaxNode *)mps);
            pMVar10 = MethodPrototypeSymbol::fromSyntax(pSVar4,syntax_01,bVar2);
            pSVar4 = &local_60->super_Scope;
            local_268 = pMVar10;
            nonstd::span_lite::
            span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                      (&local_278,&(pMVar8->super_MemberSyntax).attributes);
            Symbol::setAttributes(&pMVar10->super_Symbol,pSVar4,local_278);
            Scope::addMember(&local_60->super_Scope,&local_268->super_Symbol);
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
          ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                        *)&__end5_1.index);
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MemberSyntax_*,_unsigned_long,_slang::syntax::MemberSyntax_**,_slang::syntax::MemberSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MemberSyntax_*,_unsigned_long,_slang::syntax::MemberSyntax_**,_slang::syntax::MemberSyntax_*&>
                    *)&__end3.index);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ModportItemSyntax_*,_unsigned_long,_const_slang::syntax::ModportItemSyntax_**,_const_slang::syntax::ModportItemSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ModportItemSyntax_*,_unsigned_long,_const_slang::syntax::ModportItemSyntax_**,_const_slang::syntax::ModportItemSyntax_*&>
                  *)&__end2.index);
  } while( true );
}

Assistant:

void ModportSymbol::fromSyntax(const ASTContext& context, const ModportDeclarationSyntax& syntax,
                               SmallVectorBase<const ModportSymbol*>& results) {
    auto& comp = context.getCompilation();
    for (auto item : syntax.items) {
        auto modport = comp.emplace<ModportSymbol>(comp, item->name.valueText(),
                                                   item->name.location());
        modport->setSyntax(*item);
        modport->setAttributes(*context.scope, syntax.attributes);
        results.push_back(modport);

        for (auto port : item->ports->ports) {
            switch (port->kind) {
                case SyntaxKind::ModportSimplePortList: {
                    auto& portList = port->as<ModportSimplePortListSyntax>();
                    auto direction = SemanticFacts::getDirection(portList.direction.kind);
                    for (auto simplePort : portList.ports) {
                        switch (simplePort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction, simplePort->as<ModportNamedPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            case SyntaxKind::ModportExplicitPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction,
                                    simplePort->as<ModportExplicitPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            default:
                                ASSUME_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportSubroutinePortList: {
                    auto& portList = port->as<ModportSubroutinePortListSyntax>();
                    bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;
                    if (isExport)
                        modport->hasExports = true;

                    for (auto subPort : portList.ports) {
                        switch (subPort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    context, subPort->as<ModportNamedPortSyntax>(), isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            case SyntaxKind::ModportSubroutinePort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    *context.scope, subPort->as<ModportSubroutinePortSyntax>(),
                                    isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            default:
                                ASSUME_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportClockingPort: {
                    auto& clockingPort = port->as<ModportClockingPortSyntax>();
                    auto& mcs = ModportClockingSymbol::fromSyntax(context, clockingPort);
                    mcs.setAttributes(*modport, clockingPort.attributes);
                    modport->addMember(mcs);
                    break;
                }
                default: {
                    ASSUME_UNREACHABLE;
                }
            }
        }
    }
}